

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsOn(char *val)

{
  char *val_local;
  
  if (val == (char *)0x0) {
    val_local._7_1_ = false;
  }
  else if ((*val == '1') && (val[1] == '\0')) {
    val_local._7_1_ = true;
  }
  else if (((*val == 'O') || (*val == 'o')) &&
          (((val[1] == 'N' || (val[1] == 'n')) && (val[2] == '\0')))) {
    val_local._7_1_ = true;
  }
  else if (((*val == 'Y') || (*val == 'y')) &&
          ((val[1] == '\0' ||
           ((((val[1] == 'E' || (val[1] == 'e')) && ((val[2] == 'S' || (val[2] == 's')))) &&
            (val[3] == '\0')))))) {
    val_local._7_1_ = true;
  }
  else if (((((*val == 'T') || (*val == 't')) && ((val[1] == 'R' || (val[1] == 'r')))) &&
           ((val[2] == 'U' || (val[2] == 'u')))) &&
          (((val[3] == 'E' || (val[3] == 'e')) && (val[4] == '\0')))) {
    val_local._7_1_ = true;
  }
  else {
    val_local._7_1_ = false;
  }
  return val_local._7_1_;
}

Assistant:

bool cmSystemTools::IsOn(const char* val)
{
  if (!val) {
    return false;
  }
  /* clang-format off */
  // "1"
  if (val[0] == '1' && val[1] == '\0') {
    return true;
  }
  // "ON"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'N' || val[1] == 'n') && val[2] == '\0') {
    return true;
  }
  // "Y", "YES"
  if ((val[0] == 'Y' || val[0] == 'y') && (val[1] == '\0' || (
      (val[1] == 'E' || val[1] == 'e') &&
      (val[2] == 'S' || val[2] == 's') && val[3] == '\0'))) {
    return true;
  }
  // "TRUE"
  if ((val[0] == 'T' || val[0] == 't') &&
      (val[1] == 'R' || val[1] == 'r') &&
      (val[2] == 'U' || val[2] == 'u') &&
      (val[3] == 'E' || val[3] == 'e') && val[4] == '\0') {
    return true;
  }
  /* clang-format on */
  return false;
}